

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O2

bool __thiscall
cbtAxisSweep3Internal<unsigned_short>::testOverlap2D
          (cbtAxisSweep3Internal<unsigned_short> *this,Handle *pHandleA,Handle *pHandleB,int axis0,
          int axis1)

{
  long lVar1;
  
  lVar1 = (long)axis0;
  if (((pHandleB->m_maxEdges[lVar1 + -3] <= pHandleA->m_maxEdges[lVar1]) &&
      (pHandleA->m_maxEdges[lVar1 + -3] <= pHandleB->m_maxEdges[lVar1])) &&
     (lVar1 = (long)axis1, pHandleB->m_maxEdges[lVar1 + -3] <= pHandleA->m_maxEdges[lVar1])) {
    return pHandleA->m_maxEdges[lVar1 + -3] <= pHandleB->m_maxEdges[lVar1];
  }
  return false;
}

Assistant:

bool cbtAxisSweep3Internal<BP_FP_INT_TYPE>::testOverlap2D(const Handle* pHandleA, const Handle* pHandleB, int axis0, int axis1)
{
	//optimization 1: check the array index (memory address), instead of the m_pos

	if (pHandleA->m_maxEdges[axis0] < pHandleB->m_minEdges[axis0] ||
		pHandleB->m_maxEdges[axis0] < pHandleA->m_minEdges[axis0] ||
		pHandleA->m_maxEdges[axis1] < pHandleB->m_minEdges[axis1] ||
		pHandleB->m_maxEdges[axis1] < pHandleA->m_minEdges[axis1])
	{
		return false;
	}
	return true;
}